

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void expandFormatArguments<String,int,String,String>
               (vector<String,_std::allocator<String>_> *data,String *arg,int *rest,String *rest_1,
               String *rest_2)

{
  pointer pcVar1;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar1 = (arg->_string)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + (arg->_string)._M_string_length);
  std::vector<String,_std::allocator<String>_>::push_back(data,(value_type *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  expandFormatArguments<int,String,String>(data,rest,rest_1,rest_2);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}